

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O1

void Hex::Hexdumper<unsigned_char>::output_bin(ostream *os,remove_const_t<unsigned_char> val)

{
  ostream *poVar1;
  int iVar2;
  byte bVar3;
  ostream oVar4;
  ulong uVar5;
  int iVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  char bits [257];
  char acStack_13a [274];
  
  uVar7 = CONCAT71(in_register_00000031,val);
  uVar10 = 0;
  if ((int)uVar7 != 0) {
    uVar5 = uVar7 & 0xffffffff;
    do {
      bVar3 = (byte)uVar7;
      acStack_13a[uVar10 + 2] = bVar3 & 1 | 0x30;
      uVar10 = uVar10 + 1;
      uVar5 = uVar5 >> 1 & 0x7f;
      uVar7 = uVar5;
    } while (1 < bVar3);
  }
  iVar9 = (int)uVar10;
  acStack_13a[(uVar10 & 0xffffffff) + 2] = '\0';
  lVar8 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar8;
  iVar2 = *(int *)(os + lVar8 + 0x10);
  if (os[lVar8 + 0xe1] == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  iVar6 = iVar2 - iVar9;
  if (iVar6 == 0 || iVar2 < iVar9) {
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  }
  else {
    acStack_13a[1] = ' ';
    if ((char)*(undefined4 *)(poVar1 + 0xe0) != '\0') {
      acStack_13a[1] = (char)*(undefined4 *)(poVar1 + 0xe0);
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)iVar6;
    std::__ostream_insert<char,std::char_traits<char>>(os,acStack_13a + 1,1);
  }
  if (0 < iVar9) {
    lVar8 = (uVar10 & 0xffffffff) + 1;
    do {
      acStack_13a[1] = acStack_13a[lVar8];
      std::__ostream_insert<char,std::char_traits<char>>(os,acStack_13a + 1,1);
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }